

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O0

ostream * operator<<(ostream *os,
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                    *kv)

{
  UniValue *in_RSI;
  ostream *in_RDI;
  long in_FS_OFFSET;
  SettingsValue out;
  UniValue *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb8;
  ostream *poVar1;
  UniValue *val;
  UniValue *in_stack_fffffffffffffec8;
  UniValue *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  _Alloc_hider in_stack_fffffffffffffef0;
  UniValue local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  val = &local_80;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::UniValue(in_stack_fffffffffffffec8,(VType)((ulong)val >> 0x20),in_stack_fffffffffffffeb8
                    );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea8);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0._M_p,in_stack_fffffffffffffee8);
  UniValue::UniValue(in_RSI,in_stack_fffffffffffffed0);
  UniValue::pushKVEnd(in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8,val);
  UniValue::~UniValue(in_stack_fffffffffffffea8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea8);
  poVar1 = in_RDI;
  UniValue::write_abi_cxx11_
            ((UniValue *)&stack0xfffffffffffffee8,(int)&local_80 + 0x20,(void *)0x0,0);
  std::operator<<(poVar1,(string *)&stack0xfffffffffffffee8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea8);
  UniValue::~UniValue(in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const std::pair<std::string, common::SettingsValue>& kv)
{
    common::SettingsValue out(common::SettingsValue::VOBJ);
    out.pushKVEnd(kv.first, kv.second);
    os << out.write();
    return os;
}